

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O3

int nni_reap_sys_init(void)

{
  int iVar1;
  
  reap_exit = 0;
  nni_mtx_init(&reap_mtx);
  nni_cv_init(&reap_work_cv,&reap_mtx);
  nni_cv_init(&reap_empty_cv,&reap_mtx);
  iVar1 = nni_thr_init(&reap_thr,reap_worker,(void *)0x0);
  if (iVar1 == 0) {
    nni_thr_run(&reap_thr);
  }
  return iVar1;
}

Assistant:

int
nni_reap_sys_init(void)
{
	int rv;

	reap_exit = false;
	nni_mtx_init(&reap_mtx);
	nni_cv_init(&reap_work_cv, &reap_mtx);
	nni_cv_init(&reap_empty_cv, &reap_mtx);
	// If this fails, we don't fail init, instead we will try to
	// start up at reap time.
	if ((rv = nni_thr_init(&reap_thr, reap_worker, NULL)) != 0) {
		return (rv);
	}
	nni_thr_run(&reap_thr);
	return (0);
}